

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

bool __thiscall kj::StringPtr::operator==(StringPtr *this,StringPtr *other)

{
  size_t sVar1;
  int iVar2;
  
  sVar1 = (this->content).size_;
  if (sVar1 == (other->content).size_) {
    iVar2 = bcmp((this->content).ptr,(other->content).ptr,sVar1 - 1);
    return iVar2 == 0;
  }
  return false;
}

Assistant:

inline constexpr size_t size() const { return size_; }